

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

void __thiscall
SplitSVTest_single_word_trailing_delim_Test<unsigned_char>::
~SplitSVTest_single_word_trailing_delim_Test
          (SplitSVTest_single_word_trailing_delim_Test<unsigned_char> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 8);
	EXPECT_EQ(split_result[1].size(), 0);
}